

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

GetTraceStatsCallbackArgs * __thiscall
perfetto::TracingSession::GetTraceStatsBlocking
          (GetTraceStatsCallbackArgs *__return_storage_ptr__,TracingSession *this)

{
  bool stats_read;
  unique_lock<std::mutex> lock;
  mutex mutex;
  condition_variable cv;
  char local_a9;
  unique_lock<std::mutex> local_a8;
  long *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  __native_type local_78;
  condition_variable local_50 [48];
  
  local_78.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_78._16_8_ = 0;
  local_78.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_78.__align = 0;
  local_78._8_8_ = 0;
  ::std::condition_variable::condition_variable(local_50);
  __return_storage_ptr__->success = false;
  (__return_storage_ptr__->trace_stats_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->trace_stats_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->trace_stats_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a9 = '\0';
  local_98 = (long *)0x0;
  uStack_90 = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98 = (long *)operator_new(0x20);
  *local_98 = (long)&local_78;
  local_98[1] = (long)__return_storage_ptr__;
  local_98[2] = (long)&local_a9;
  local_98[3] = (long)local_50;
  pcStack_80 = std::
               _Function_handler<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:46069:7)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:46069:7)>
             ::_M_manager;
  (*this->_vptr_TracingSession[0xd])(this);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  local_a8._M_owns = false;
  local_a8._M_device = (mutex_type *)&local_78;
  std::unique_lock<std::mutex>::lock(&local_a8);
  local_a8._M_owns = true;
  if (local_a9 == '\0') {
    do {
      ::std::condition_variable::wait((unique_lock *)local_50);
    } while (local_a9 != '\x01');
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  ::std::condition_variable::~condition_variable(local_50);
  return __return_storage_ptr__;
}

Assistant:

TracingSession::GetTraceStatsCallbackArgs
TracingSession::GetTraceStatsBlocking() {
  std::mutex mutex;
  std::condition_variable cv;
  GetTraceStatsCallbackArgs result;
  bool stats_read = false;

  GetTraceStats(
      [&mutex, &result, &stats_read, &cv](GetTraceStatsCallbackArgs args) {
        result = std::move(args);
        std::unique_lock<std::mutex> lock(mutex);
        stats_read = true;
        cv.notify_one();
      });

  {
    std::unique_lock<std::mutex> lock(mutex);
    cv.wait(lock, [&stats_read] { return stats_read; });
  }
  return result;
}